

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef lj_record_constify(jit_State *J,cTValue *o)

{
  uint uVar1;
  TRef TVar2;
  IRType t;
  
  uVar1 = (o->field_2).it;
  if (uVar1 + 0xd < 9) {
    t = IRT_NUM;
    if (0xfffefffe < uVar1) {
      t = ~uVar1;
    }
    TVar2 = lj_ir_kgc(J,(GCobj *)(ulong)(o->u32).lo,t);
    return TVar2;
  }
  if (uVar1 < 0xfffeffff) {
    TVar2 = lj_ir_knumint(J,o->n);
    return TVar2;
  }
  TVar2 = 0;
  if (uVar1 + 3 < 2) {
    TVar2 = ~uVar1 * 0xffffff + 0x7fff;
  }
  return TVar2;
}

Assistant:

TRef lj_record_constify(jit_State *J, cTValue *o)
{
  if (tvisgcv(o))
    return lj_ir_kgc(J, gcV(o), itype2irt(o));
  else if (tvisint(o))
    return lj_ir_kint(J, intV(o));
  else if (tvisnum(o))
    return lj_ir_knumint(J, numV(o));
  else if (tvisbool(o))
    return TREF_PRI(itype2irt(o));
  else
    return 0;  /* Can't represent lightuserdata (pointless). */
}